

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabulatedSpectrum.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::~TabulatedSpectrum(TabulatedSpectrum *this)

{
  pointer plVar1;
  
  std::
  vector<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<5>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ::~vector(&(this->data_).sequence_);
  plVar1 = (this->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)*(pointer *)
                                  ((long)&(this->data_).interpolation_.super_InterpolationBase.
                                          interpolationSchemeIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar1);
  }
  plVar1 = (this->data_).interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)*(pointer *)
                                  ((long)&(this->data_).interpolation_.super_InterpolationBase.
                                          boundaryIndices.
                                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                          super__Vector_impl_data + 0x10) - (long)plVar1);
    return;
  }
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT TabulatedSpectrum {

public:

  #include "ENDFtk/section/5/TabulatedSpectrum/OutgoingEnergyDistribution.hpp"

private:

  /* members */
  InterpolationSequenceRecord< OutgoingEnergyDistribution > data_;

  /* auxiliary functions */

public:

  /* constructor */
  #include "ENDFtk/section/5/TabulatedSpectrum/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the distribution type (the LF flag)
   */
  static constexpr int LF() { return 1; }

  /**
   *  @brief Return the distribution type (the LF flag)
   */
  int LAW() const { return this->LF(); }

  /**
   *  @brief Return the number of interpolation ranges on the incident energy
   *         grid
   */
  long NR() const { return this->data_.tab2().NR(); }

  /**
   *  @brief Return the number of interpolation ranges on the incident energy
   *         grid
   */
  long numberInterpolationRegions() const { return this->NR(); }

  /**
   *  @brief Return the number of incoming energy values
   */
  long NE() const { return this->data_.tab2().NZ(); }

  /**
   *  @brief Return the number of incoming energy values
   */
  long numberIncidentEnergies() const { return this->NE(); }

  /**
   *  @brief Return the outgoing energy distributions
   */
  auto outgoingDistributions() const {

    return this->data_.records();
  }

  /**
   *  @brief Return the incoming energies
   */
  auto incidentEnergies() const {

    return this->outgoingDistributions()
             | ranges::cpp20::views::transform(
                 [] ( const auto& entry )
                    { return entry.incidentEnergy(); } ); }

  /**
   *  @brief Return interpolation type for each range on the incoming
   *         energy grid
   */
  auto INT() const { return this->data_.tab2().INT(); }

  /**
   *  @brief Return interpolation type for each range on the incoming
   *         energy grid
   */
  auto interpolants() const { return this->INT(); }

  /**
   *  @brief Return interpolation boundaries for the incoming
   *         energy grid
   */
  auto NBT() const { return this->data_.tab2().NBT(); }

  /**
   *  @brief Return interpolation boundaries for the incoming
   *         energy grid
   */
  auto boundaries() const { return this->NBT(); }

  /**
   *  @brief Return the number of lines in this MF5 component
   */
  long NC() const { return this->data_.NC(); }

  #include "ENDFtk/section/5/TabulatedSpectrum/src/print.hpp"
}